

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureMultisampleTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_1::NegativeFramebufferCase::getFormatSamples
          (NegativeFramebufferCase *this,GLenum target,vector<int,_std::allocator<int>_> *samples)

{
  uint uVar1;
  int iVar2;
  deUint32 err;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  GLint64 *pGVar4;
  GLdouble *pGVar5;
  int local_1a4c;
  undefined1 local_1a48 [4];
  int sampleCount;
  Functions gl;
  vector<int,_std::allocator<int>_> *samples_local;
  GLenum target_local;
  NegativeFramebufferCase *this_local;
  
  gl.waitSync = (glWaitSyncFunc)samples;
  pRVar3 = Context::getRenderContext((this->super_TestCase).m_context);
  iVar2 = (*pRVar3->_vptr_RenderContext[3])();
  memcpy(local_1a48,(void *)CONCAT44(extraout_var,iVar2),0x1a28);
  local_1a4c = 0;
  (*gl.getInternalformati64v)(target,this->m_internalFormat,0x9380,1,(GLint64 *)&local_1a4c);
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)gl.waitSync,(long)local_1a4c);
  iVar2 = local_1a4c;
  if (0 < local_1a4c) {
    uVar1 = this->m_internalFormat;
    pGVar4 = (GLint64 *)
             std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)gl.waitSync,0);
    pGVar5 = (GLdouble *)(ulong)uVar1;
    (*gl.getInternalformati64v)(target,uVar1,0x80a9,iVar2,pGVar4);
    err = (*gl.getDoublev)(target,pGVar5);
    glu::checkError(err,"get max samples",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTextureMultisampleTests.cpp"
                    ,0x702);
  }
  return;
}

Assistant:

void NegativeFramebufferCase::getFormatSamples (glw::GLenum target, std::vector<int>& samples)
{
	const glw::Functions	gl			= m_context.getRenderContext().getFunctions();
	int						sampleCount	= 0;

	gl.getInternalformativ(target, m_internalFormat, GL_NUM_SAMPLE_COUNTS, 1, &sampleCount);
	samples.resize(sampleCount);

	if (sampleCount > 0)
	{
		gl.getInternalformativ(target, m_internalFormat, GL_SAMPLES, sampleCount, &samples[0]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "get max samples");
	}
}